

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

LY_ERR yang_print_compiled(ly_out *out,lys_module *module,uint32_t options)

{
  lysc_module *plVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  ly_out *out_00;
  uint uVar4;
  ulong uVar5;
  char *text;
  ulong uVar6;
  long lVar7;
  lysc_ident *plVar8;
  lysc_node *node;
  lysc_node_action *action;
  lysc_node_notif *notif;
  anon_union_24_2_d9db4c5a_for_lys_ypr_ctx_0 local_58;
  undefined4 local_40;
  ly_out *local_38;
  
  plVar1 = module->compiled;
  local_58.field_0.flags = 0;
  local_40 = 1;
  local_58.field_0.out = out;
  local_58.field_0.options = options;
  local_58.field_0.module = module;
  local_38 = out;
  ly_print_(out,"%*smodule %s {\n",0,"");
  local_58.field_0.level = 1;
  ypr_substmt((lys_ypr_ctx *)&local_58.field_0,LY_STMT_NAMESPACE,'\0',module->ns,'\0',plVar1->exts);
  ypr_substmt((lys_ypr_ctx *)&local_58.field_0,LY_STMT_PREFIX,'\0',module->prefix,'\0',plVar1->exts)
  ;
  uVar3 = local_58.field_0.flags;
  uVar2 = local_58.field_0.level;
  local_58._8_4_ = CONCAT22(local_58.field_0.flags,local_58.field_0.level) | 0x10000;
  text = module->org;
  if ((((text == (char *)0x0) && (module->contact == (char *)0x0)) && (module->dsc == (char *)0x0))
     && (module->ref == (char *)0x0)) {
    text = (char *)0x0;
  }
  else {
    local_58._8_4_ = CONCAT22(uVar3,uVar2) & 0xfffeffff;
    if ((local_58.field_0.options & 2) == 0) {
      ly_print_(local_58.field_0.out,"\n");
      text = module->org;
    }
  }
  ypr_substmt((lys_ypr_ctx *)&local_58.field_0,LY_STMT_ORGANIZATION,'\0',text,'\0',plVar1->exts);
  ypr_substmt((lys_ypr_ctx *)&local_58.field_0,LY_STMT_CONTACT,'\0',module->contact,'\0',
              plVar1->exts);
  ypr_substmt((lys_ypr_ctx *)&local_58.field_0,LY_STMT_DESCRIPTION,'\0',module->dsc,'\0',
              plVar1->exts);
  ypr_substmt((lys_ypr_ctx *)&local_58.field_0,LY_STMT_REFERENCE,'\0',module->ref,'\0',plVar1->exts)
  ;
  if (((module->org != (char *)0x0) || (module->contact != (char *)0x0)) ||
     ((module->dsc != (char *)0x0 || (module->ref != (char *)0x0)))) {
    local_58._8_4_ = local_58._8_4_ | 0x10000;
  }
  if (module->revision != (char *)0x0) {
    if (((local_58._8_4_ & 0x10000) != 0) &&
       (local_58._8_4_ = local_58._8_4_ & 0xfffeffff, (local_58.field_0.options & 2) == 0)) {
      ly_print_(local_58.field_0.out,"\n");
    }
    uVar4 = (local_58._8_4_ & 0xffff) * 2;
    if ((local_58.field_0.options & 2) != 0) {
      uVar4 = 0;
    }
    ly_print_(local_58.field_0.out,"%*srevision %s;\n",(ulong)uVar4,"");
    local_58._8_4_ = local_58._8_4_ | 0x10000;
  }
  if (plVar1->exts != (lysc_ext_instance *)0x0) {
    if (((local_58._8_4_ & 0x10000) != 0) &&
       (local_58._8_4_ = local_58._8_4_ & 0xfffeffff, (local_58.field_0.options & 2) == 0)) {
      ly_print_(local_58.field_0.out,"\n");
    }
    yprc_extension_instances
              ((lys_ypr_ctx *)&local_58.field_0,LY_STMT_MODULE,'\0',module->compiled->exts,
               (ly_bool *)0x0);
    local_58._8_4_ = local_58._8_4_ | 0x10000;
  }
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    plVar8 = module->identities;
    if (plVar8 == (lysc_ident *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ulong *)&plVar8[-1].flags;
    }
    if (uVar5 <= uVar6) break;
    if (((local_58._8_4_ & 0x10000) != 0) &&
       (local_58._8_4_ = local_58._8_4_ & 0xfffeffff, (local_58.field_0.options & 2) == 0)) {
      ly_print_(local_58.field_0.out,"\n");
      plVar8 = module->identities;
    }
    yprc_identity((lys_ypr_ctx *)&local_58.field_0,(lysc_ident *)((long)&plVar8->name + lVar7));
    local_58._8_4_ = local_58._8_4_ | 0x10000;
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
  }
  if ((local_58.field_0.options & 0x10) == 0) {
    node = plVar1->data;
    if (node != (lysc_node *)0x0) {
      do {
        if (((local_58._8_4_ & 0x10000) != 0) &&
           (local_58._8_4_ = local_58._8_4_ & 0xfffeffff, (local_58.field_0.options & 2) == 0)) {
          ly_print_(local_58.field_0.out,"\n");
        }
        yprc_node((lys_ypr_ctx *)&local_58.field_0,node);
        node = node->next;
      } while (node != (lysc_node *)0x0);
      if (plVar1->data != (lysc_node *)0x0) {
        local_58._8_4_ = local_58._8_4_ | 0x10000;
      }
    }
    action = plVar1->rpcs;
    if (action != (lysc_node_action *)0x0) {
      do {
        if (((local_58._8_4_ & 0x10000) != 0) &&
           (local_58._8_4_ = local_58._8_4_ & 0xfffeffff, (local_58.field_0.options & 2) == 0)) {
          ly_print_(local_58.field_0.out,"\n");
        }
        yprc_action((lys_ypr_ctx *)&local_58.field_0,action);
        action = (action->field_0).field_1.next;
      } while (action != (lysc_node_action *)0x0);
      if (plVar1->rpcs != (lysc_node_action *)0x0) {
        local_58._8_4_ = local_58._8_4_ | 0x10000;
      }
    }
    notif = plVar1->notifs;
    if (notif != (lysc_node_notif *)0x0) {
      do {
        if (((local_58._8_4_ & 0x10000) != 0) &&
           (local_58._8_4_ = local_58._8_4_ & 0xfffeffff, (local_58.field_0.options & 2) == 0)) {
          ly_print_(local_58.field_0.out,"\n");
        }
        yprc_notification((lys_ypr_ctx *)&local_58.field_0,notif);
        notif = (notif->field_0).field_1.next;
      } while (notif != (lysc_node_notif *)0x0);
      if (plVar1->notifs != (lysc_node_notif *)0x0) {
        local_58._8_4_ = local_58._8_4_ | 0x10000;
      }
    }
  }
  out_00 = local_38;
  uVar4 = local_58._8_4_ - 1;
  local_58.field_0.level = (short)uVar4;
  uVar4 = (uVar4 & 0xffff) * 2;
  if ((local_58.field_0.options & 2) != 0) {
    uVar4 = 0;
  }
  ly_print_(local_38,"%*s}\n",(ulong)uVar4,"");
  ly_print_flush(out_00);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
yang_print_compiled(struct ly_out *out, const struct lys_module *module, uint32_t options)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_module *modc = module->compiled;
    struct lys_ypr_ctx pctx_ = {
        .out = out,
        .level = 0,
        .options = options,
        .module = module,
        .schema = LYS_YPR_COMPILED
    }, *pctx = &pctx_;

    ly_print_(pctx->out, "%*smodule %s {\n", INDENT, module->name);
    LEVEL++;

    /* module-header-stmts */
    ypr_substmt(pctx, LY_STMT_NAMESPACE, 0, module->ns, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_PREFIX, 0, module->prefix, 0, modc->exts);

    YPR_EXTRA_LINE(1, pctx);

    /* no linkage-stmts */

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        YPR_EXTRA_LINE_PRINT(pctx);
    }
    ypr_substmt(pctx, LY_STMT_ORGANIZATION, 0, module->org, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_CONTACT, 0, module->contact, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, module->dsc, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_REFERENCE, 0, module->ref, 0, modc->exts);

    YPR_EXTRA_LINE(module->org || module->contact || module->dsc || module->ref, pctx);

    /* revision-stmts */
    if (module->revision) {
        YPR_EXTRA_LINE_PRINT(pctx);
        ly_print_(pctx->out, "%*srevision %s;\n", INDENT, module->revision);
        YPR_EXTRA_LINE(1, pctx);
    }

    /* body-stmts */
    if (modc->exts) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprc_extension_instances(pctx, LY_STMT_MODULE, 0, module->compiled->exts, NULL);
        YPR_EXTRA_LINE(1, pctx);
    }

    LY_ARRAY_FOR(module->identities, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprc_identity(pctx, &module->identities[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        struct lysc_node *data;
        struct lysc_node_action *rpc;
        struct lysc_node_notif *notif;

        LY_LIST_FOR(modc->data, data) {
            YPR_EXTRA_LINE_PRINT(pctx);
            yprc_node(pctx, data);
        }

        YPR_EXTRA_LINE(modc->data, pctx);

        LY_LIST_FOR(modc->rpcs, rpc) {
            YPR_EXTRA_LINE_PRINT(pctx);
            yprc_action(pctx, rpc);
        }

        YPR_EXTRA_LINE(modc->rpcs, pctx);

        LY_LIST_FOR(modc->notifs, notif) {
            YPR_EXTRA_LINE_PRINT(pctx);
            yprc_notification(pctx, notif);
        }

        YPR_EXTRA_LINE(modc->notifs, pctx);
    }

    LEVEL--;
    ly_print_(out, "%*s}\n", INDENT);
    ly_print_flush(out);

    return LY_SUCCESS;
}